

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

float __thiscall
deqp::gles2::Performance::vectorFloatStandardDeviation<long>
          (Performance *this,vector<long,_std::allocator<long>_> *v)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  uVar3 = (long)v - (long)this >> 3;
  uVar2 = (uint)uVar3;
  if ((int)uVar2 < 1) {
    if ((long)uVar3 < 0) {
      fVar5 = (float)uVar3;
    }
    else {
      fVar5 = (float)(long)uVar3;
    }
  }
  else {
    fVar6 = 0.0;
    uVar1 = 0;
    do {
      fVar6 = fVar6 + (float)*(long *)(this + uVar1 * 8);
      uVar1 = uVar1 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar1);
    fVar5 = (float)uVar3;
    if (0 < (int)uVar2) {
      fVar4 = 0.0;
      uVar3 = 0;
      do {
        fVar7 = (float)*(long *)(this + uVar3 * 8) - fVar6 / fVar5;
        fVar4 = fVar4 + fVar7 * fVar7;
        uVar3 = uVar3 + 1;
      } while ((uVar2 & 0x7fffffff) != uVar3);
      goto LAB_004342d4;
    }
  }
  fVar4 = 0.0;
LAB_004342d4:
  fVar4 = fVar4 / fVar5;
  if (0.0 <= fVar4) {
    return SQRT(fVar4);
  }
  fVar5 = sqrtf(fVar4);
  return fVar5;
}

Assistant:

static float vectorFloatStandardDeviation (const vector<T>& v)
{
	float average	= vectorFloatAverage(v);
	float result	= 0.0f;
	for (int i = 0; i < (int)v.size(); i++)
	{
		float d = (float)v[i] - average;
		result += d*d;
	}
	return deFloatSqrt(result/(float)v.size());
}